

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O2

void __thiscall CVmImageWriter::write_meta_dep_item(CVmImageWriter *this,char *metaclass_name)

{
  long lVar1;
  
  end_meta_prop_list(this);
  lVar1 = CVmFile::get_pos(this->fp_);
  this->mcld_ofs_pos_ = lVar1;
  CVmFile::write_uint2(this->fp_,0);
  write_dep_block_item(this,metaclass_name);
  lVar1 = CVmFile::get_pos(this->fp_);
  this->mcld_propcnt_pos_ = lVar1;
  CVmFile::write_uint2(this->fp_,0);
  CVmFile::write_uint2(this->fp_,2);
  this->mcld_prop_cnt_ = 0;
  return;
}

Assistant:

void CVmImageWriter::write_meta_dep_item(const char *metaclass_name)
{
    /* if we didn't end the previous item's property list, end it now */
    end_meta_prop_list();

    /* write a placeholder next record offset */
    mcld_ofs_pos_ = fp_->get_pos();
    fp_->write_uint2(0);
    
    /* write the metaclass name */
    write_dep_block_item(metaclass_name);

    /* write a placeholder property vector count */
    mcld_propcnt_pos_ = fp_->get_pos();
    fp_->write_uint2(0);

    /* write the property record size (2 bytes) */
    fp_->write_uint2(2);

    /* no properties yet */
    mcld_prop_cnt_ = 0;
}